

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O3

gdImagePtr gdImageCreateFromGifCtx(gdIOCtxPtr fd)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  gdImagePtr im;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  uint color;
  uchar (*cmap) [256];
  uint uVar10;
  uchar c;
  uchar buf [16];
  int ZeroDataBlock;
  uchar localColorMap [3] [256];
  uchar ColorMap [3] [256];
  char local_761;
  uint local_760;
  uint local_75c;
  ushort local_758;
  char cStack_756;
  undefined1 uStack_755;
  byte bStack_754;
  char cStack_753;
  ushort local_752;
  uint local_750;
  uint local_744;
  uint local_740;
  int local_73c;
  uint local_738 [64];
  uchar local_638 [768];
  uchar local_338 [776];
  
  local_73c = 0;
  memset(local_338,0,0x300);
  memset(local_638,0,0x300);
  iVar6 = gdGetBuf(&local_758,6,fd);
  if (iVar6 != 6) {
    return (gdImagePtr)0x0;
  }
  if ((cStack_756 == 'F' && local_758 == 0x4947) &&
     (((cStack_753 == 'a' && CONCAT11(bStack_754,uStack_755) == 0x3738 ||
       (cStack_753 == 'a' && CONCAT11(bStack_754,uStack_755) == 0x3938)) &&
      (iVar6 = gdGetBuf(&local_758,7,fd), uVar3 = local_758, iVar6 == 7)))) {
    uVar2 = CONCAT11(uStack_755,cStack_756);
    uVar10 = (uint)bStack_754;
    if (((-1 < (char)bStack_754) ||
        (iVar6 = ReadColorMap(fd,2 << (bStack_754 & 7),(uchar (*) [256])local_338), iVar6 == 0)) &&
       (iVar6 = gdGetBuf(&local_761,1,fd), iVar6 == 1)) {
      local_760 = (uint)uVar3;
      local_740 = (uint)uVar2;
      color = 0xffffffff;
      local_744 = uVar10;
      do {
        if (local_761 == '!') {
          iVar6 = gdGetBuf(&local_761,1,fd);
          if (iVar6 != 1) {
            return (gdImagePtr)0x0;
          }
          if (local_761 == -7) {
            local_738[0] = 0;
            local_75c = color;
            GetDataBlock(fd,(uchar *)local_738,&local_73c);
            uVar5 = local_738[0];
            uVar10 = local_738[0] >> 0x18;
            do {
              iVar6 = GetDataBlock(fd,(uchar *)local_738,&local_73c);
            } while (0 < iVar6);
            color = local_75c;
            if ((uVar5 & 1) != 0) {
              color = uVar10;
            }
          }
          else {
            do {
              iVar6 = GetDataBlock(fd,(uchar *)local_738,&local_73c);
            } while (0 < iVar6);
          }
        }
        else {
          if (local_761 == ',') {
            iVar6 = gdGetBuf(&local_758,9,fd);
            if (iVar6 != 9) break;
            bVar4 = (byte)local_750;
            bVar8 = (byte)local_750 & 7;
            local_75c = (uint)CONCAT11(cStack_753,bStack_754);
            if (((local_760 < local_758 + local_75c) ||
                (local_760 = (uint)local_752,
                local_740 < CONCAT11(uStack_755,cStack_756) + local_760)) ||
               (im = gdImageCreate((uint)CONCAT11(cStack_753,bStack_754),(uint)local_752),
               im == (gdImagePtr)0x0)) break;
            uVar10 = local_750 >> 6 & 1;
            im->interlace = uVar10;
            if ((char)bVar4 < '\0') {
              iVar6 = ReadColorMap(fd,1 << bVar8 + 1,(uchar (*) [256])local_638);
              if (iVar6 != 0) goto LAB_00115ae3;
              uVar10 = local_750 >> 6 & 1;
              cmap = (uchar (*) [256])local_638;
            }
            else {
              if (-1 < (char)local_744) goto LAB_00115ae3;
              cmap = (uchar (*) [256])local_338;
            }
            ReadImage(im,fd,local_75c,local_760,cmap,uVar10,&local_73c);
            if (color != 0xffffffff) {
              gdImageColorTransparent(im,color);
            }
            uVar7 = (ulong)im->colorsTotal;
            if (0 < (long)uVar7) goto LAB_00115abb;
            goto LAB_00115ad9;
          }
          if (local_761 == ';') {
            return (gdImagePtr)0x0;
          }
        }
        iVar6 = gdGetBuf(&local_761,1,fd);
        if (iVar6 != 1) {
          return (gdImagePtr)0x0;
        }
      } while( true );
    }
  }
  goto LAB_0011581d;
LAB_00115ad9:
  uVar9 = uVar7 & 0xffffffff;
  goto LAB_00115adb;
  while( true ) {
    uVar9 = uVar7 - 1;
    im->colorsTotal = (int)uVar9;
    bVar1 = uVar7 < 2;
    uVar7 = uVar9;
    if (bVar1) break;
LAB_00115abb:
    if (im->open[uVar7 - 1] == 0) goto LAB_00115ad9;
  }
LAB_00115adb:
  if ((int)uVar9 == 0) {
LAB_00115ae3:
    gdImageDestroy(im);
LAB_0011581d:
    im = (gdImagePtr)0x0;
  }
  return im;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGifCtx(gdIOCtxPtr fd)
{
	int BitPixel;
#if 0
	int ColorResolution;
	int Background;
	int AspectRatio;
#endif
	int Transparent = (-1);
	unsigned char buf[16];
	unsigned char c;
	unsigned char ColorMap[3][MAXCOLORMAPSIZE];
	unsigned char localColorMap[3][MAXCOLORMAPSIZE];
	int imw, imh, screen_width, screen_height;
	int useGlobalColormap;
	int bitPixel, i;
	/*1.4//int             imageCount = 0; */
	/* 2.0.28: threadsafe storage */
	int ZeroDataBlock = FALSE;
	int haveGlobalColormap;

	gdImagePtr im = 0;

	memset(ColorMap, 0, 3 * MAXCOLORMAPSIZE);
	memset(localColorMap, 0, 3 * MAXCOLORMAPSIZE);

	if(!ReadOK(fd, buf, 6)) {
		return 0;
	}

	if(strncmp((char *)buf, "GIF", 3) != 0) {
		return 0;
	}

	if(memcmp((char *)buf + 3, "87a", 3) == 0) {
		/* GIF87a */
	} else if(memcmp((char *)buf + 3, "89a", 3) == 0) {
		/* GIF89a */
	} else {
		return 0;
	}

	if(!ReadOK(fd, buf, 7)) {
		return 0;
	}

	BitPixel = 2 << (buf[4] & 0x07);
#if 0
	ColorResolution = (int) (((buf[4]&0x70)>>3)+1);
	Background = buf[5];
	AspectRatio = buf[6];
#endif
	screen_width = imw = LM_to_uint(buf[0], buf[1]);
	screen_height = imh = LM_to_uint(buf[2], buf[3]);

	haveGlobalColormap = BitSet(buf[4], LOCALCOLORMAP); /* Global Colormap */
	if(haveGlobalColormap) {
		if(ReadColorMap(fd, BitPixel, ColorMap)) {
			return 0;
		}
	}

	for (;;) {
		int top, left;
		int width, height;

		if(!ReadOK(fd, &c, 1)) {
			return 0;
		}

		if (c == ';') { /* GIF terminator */
			goto terminated;
		}

		if(c == '!') { /* Extension */
			if(!ReadOK(fd, &c, 1)) {
				return 0;
			}

			DoExtension(fd, c, &Transparent, &ZeroDataBlock);
			continue;
		}

		if(c != ',') { /* Not a valid start character */
			continue;
		}

		/*1.4//++imageCount; */

		if(!ReadOK(fd, buf, 9)) {
			return 0;
		}

		useGlobalColormap = !BitSet(buf[8], LOCALCOLORMAP);

		bitPixel = 1 << ((buf[8] & 0x07) + 1);
		left = LM_to_uint(buf[0], buf[1]);
		top = LM_to_uint(buf[2], buf[3]);
		width = LM_to_uint(buf[4], buf[5]);
		height = LM_to_uint(buf[6], buf[7]);

		if(((left + width) > screen_width) || ((top + height) > screen_height)) {
			if(VERBOSE) {
				printf("Frame is not confined to screen dimension.\n");
			}
			return 0;
		}

		if(!(im = gdImageCreate(width, height))) {
			return 0;
		}

		im->interlace = BitSet(buf[8], INTERLACE);
		if(!useGlobalColormap) {
			if(ReadColorMap(fd, bitPixel, localColorMap)) {
				gdImageDestroy(im);
				return 0;
			}

			ReadImage(im, fd, width, height, localColorMap, BitSet(buf[8], INTERLACE), &ZeroDataBlock);
		} else {
			if(!haveGlobalColormap) {
				gdImageDestroy(im);
				return 0;
			}

			ReadImage(im, fd, width, height, ColorMap, BitSet(buf[8], INTERLACE), &ZeroDataBlock);
		}

		if(Transparent != (-1)) {
			gdImageColorTransparent(im, Transparent);
		}

		goto terminated;
	}

terminated:
	/* Terminator before any image was declared! */
	if(!im) {
		return 0;
	}

	/* Check for open colors at the end, so
	 * we can reduce colorsTotal and ultimately
	 * BitsPerPixel */
	for(i = im->colorsTotal - 1; i >= 0; i--) {
		if(im->open[i]) {
			im->colorsTotal--;
		} else {
			break;
		}
	}

	if(!im->colorsTotal) {
		gdImageDestroy(im);
		return 0;
	}

	return im;
}